

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QList<QWidgetItemData>_>::data(QList<QList<QWidgetItemData>_> *this)

{
  QArrayDataPointer<QList<QWidgetItemData>_> *this_00;
  QList<QWidgetItemData> *pQVar1;
  QArrayDataPointer<QList<QWidgetItemData>_> *in_RDI;
  
  detach((QList<QList<QWidgetItemData>_> *)0x921abc);
  this_00 = (QArrayDataPointer<QList<QWidgetItemData>_> *)
            QArrayDataPointer<QList<QWidgetItemData>_>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QList<QWidgetItemData>_>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }